

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddProperties<char_const*,char_const*,std::__cxx11::string>
          (Node *this,char *value,char *more,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local_1;
  char *more_local;
  char *value_local;
  Node *this_local;
  
  local_28 = more_1;
  more_local_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)more;
  more_local = value;
  value_local = (char *)this;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<char_const*&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,&more_local);
  value_00 = more_local_1;
  std::__cxx11::string::string((string *)&local_48,(string *)more_1);
  AddProperties<char_const*,std::__cxx11::string>(this,(char *)value_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }